

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O0

void ncnn::compute_B_int8_scale(Mat *B,float *scale)

{
  float *in_stack_000000b8;
  Mat *in_stack_000000c0;
  
  compute_B_fp32_int8_scale(in_stack_000000c0,in_stack_000000b8);
  return;
}

Assistant:

static void compute_B_int8_scale(const Mat& B, float& scale)
{
    compute_B_fp32_int8_scale(B, scale);
}